

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

void __thiscall Assimp::ZipArchiveIOSystem::Implement::~Implement(Implement *this)

{
  Implement *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
  ::clear(&this->m_ArchiveMap);
  if (this->m_ZipFileHandle != (unzFile)0x0) {
    unzClose(this->m_ZipFileHandle);
    this->m_ZipFileHandle = (unzFile)0x0;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
  ::~map(&this->m_ArchiveMap);
  return;
}

Assistant:

ZipArchiveIOSystem::Implement::~Implement() {
        m_ArchiveMap.clear();

        if (m_ZipFileHandle != nullptr) {
            unzClose(m_ZipFileHandle);
            m_ZipFileHandle = nullptr;
        }
    }